

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O0

void dec_get_part_info(com_core_t *core,com_part_info_t *sub_info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int qh;
  int qw;
  int part_size;
  int h;
  int w;
  int y;
  int x;
  int i;
  com_part_info_t *sub_info_local;
  com_core_t *core_local;
  
  iVar1 = core->cu_pix_x;
  iVar2 = core->cu_pix_y;
  iVar6 = core->cu_width;
  iVar5 = core->cu_height;
  iVar3 = iVar6 >> 2;
  iVar4 = iVar5 >> 2;
  switch(core->pb_part) {
  case 0:
    sub_info->num_sub_part = '\x01';
    sub_info->sub_x[0] = iVar1;
    sub_info->sub_y[0] = iVar2;
    sub_info->sub_w[0] = iVar6;
    sub_info->sub_h[0] = iVar5;
    break;
  case 1:
    sub_info->num_sub_part = '\x02';
    for (y = 0; y < (int)(uint)sub_info->num_sub_part; y = y + 1) {
      sub_info->sub_x[y] = iVar1;
      sub_info->sub_y[y] = iVar4 * (uint)(y != 0) + iVar2;
      sub_info->sub_w[y] = iVar6;
      iVar5 = 3;
      if (y == 0) {
        iVar5 = 1;
      }
      sub_info->sub_h[y] = iVar4 * iVar5;
    }
    break;
  case 2:
    sub_info->num_sub_part = '\x02';
    for (y = 0; y < (int)(uint)sub_info->num_sub_part; y = y + 1) {
      sub_info->sub_x[y] = iVar1;
      iVar5 = 3;
      if (y == 0) {
        iVar5 = 0;
      }
      sub_info->sub_y[y] = iVar4 * iVar5 + iVar2;
      sub_info->sub_w[y] = iVar6;
      iVar5 = 1;
      if (y == 0) {
        iVar5 = 3;
      }
      sub_info->sub_h[y] = iVar4 * iVar5;
    }
    break;
  case 3:
    sub_info->num_sub_part = '\x02';
    for (y = 0; y < (int)(uint)sub_info->num_sub_part; y = y + 1) {
      sub_info->sub_x[y] = iVar3 * (uint)(y != 0) + iVar1;
      sub_info->sub_y[y] = iVar2;
      iVar6 = 3;
      if (y == 0) {
        iVar6 = 1;
      }
      sub_info->sub_w[y] = iVar3 * iVar6;
      sub_info->sub_h[y] = iVar5;
    }
    break;
  case 4:
    sub_info->num_sub_part = '\x02';
    for (y = 0; y < (int)(uint)sub_info->num_sub_part; y = y + 1) {
      iVar6 = 3;
      if (y == 0) {
        iVar6 = 0;
      }
      sub_info->sub_x[y] = iVar3 * iVar6 + iVar1;
      sub_info->sub_y[y] = iVar2;
      iVar6 = 1;
      if (y == 0) {
        iVar6 = 3;
      }
      sub_info->sub_w[y] = iVar3 * iVar6;
      sub_info->sub_h[y] = iVar5;
    }
    break;
  case 5:
    sub_info->num_sub_part = '\x04';
    for (y = 0; y < (int)(uint)sub_info->num_sub_part; y = y + 1) {
      iVar6 = 2;
      if (y == 0 || y == 2) {
        iVar6 = 0;
      }
      sub_info->sub_x[y] = iVar3 * iVar6 + iVar1;
      iVar6 = 2;
      if ((uint)y < 2) {
        iVar6 = 0;
      }
      sub_info->sub_y[y] = iVar4 * iVar6 + iVar2;
      sub_info->sub_w[y] = iVar3 << 1;
      sub_info->sub_h[y] = iVar4 << 1;
    }
    break;
  case 6:
    sub_info->num_sub_part = '\x04';
    for (y = 0; y < (int)(uint)sub_info->num_sub_part; y = y + 1) {
      sub_info->sub_x[y] = iVar1;
      sub_info->sub_y[y] = iVar4 * y + iVar2;
      sub_info->sub_w[y] = iVar6;
      sub_info->sub_h[y] = iVar4;
    }
    break;
  case 7:
    sub_info->num_sub_part = '\x04';
    for (y = 0; y < (int)(uint)sub_info->num_sub_part; y = y + 1) {
      sub_info->sub_x[y] = iVar3 * y + iVar1;
      sub_info->sub_y[y] = iVar2;
      sub_info->sub_w[y] = iVar3;
      sub_info->sub_h[y] = iVar5;
    }
  }
  return;
}

Assistant:

void dec_get_part_info(com_core_t *core, com_part_info_t* sub_info)
{
    int i;
    int x = core->cu_pix_x;
    int y = core->cu_pix_y;
    int w = core->cu_width;
    int h = core->cu_height;
    int part_size = core->pb_part;
    int qw = w >> MIN_CU_LOG2;
    int qh = h >> MIN_CU_LOG2;

    switch (part_size)
    {
    case SIZE_2Nx2N:
        sub_info->num_sub_part = 1;
        sub_info->sub_x[0] = x;
        sub_info->sub_y[0] = y;
        sub_info->sub_w[0] = w;
        sub_info->sub_h[0] = h;
        break;
    case SIZE_2NxhN:
        sub_info->num_sub_part = 4;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = x;
            sub_info->sub_y[i] = qh * i + y;
            sub_info->sub_w[i] = w;
            sub_info->sub_h[i] = qh;
        }
        break;
    case SIZE_2NxnU:
        sub_info->num_sub_part = 2;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = x;
            sub_info->sub_y[i] = qh * (i == 0 ? 0 : 1) + y;
            sub_info->sub_w[i] = w;
            sub_info->sub_h[i] = qh * (i == 0 ? 1 : 3);
        }
        break;
    case SIZE_2NxnD:
        sub_info->num_sub_part = 2;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = x;
            sub_info->sub_y[i] = qh * (i == 0 ? 0 : 3) + y;
            sub_info->sub_w[i] = w;
            sub_info->sub_h[i] = qh * (i == 0 ? 3 : 1);
        }
        break;
    case SIZE_hNx2N:
        sub_info->num_sub_part = 4;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = qw * i + x;
            sub_info->sub_y[i] = y;
            sub_info->sub_w[i] = qw;
            sub_info->sub_h[i] = h;
        }
        break;
    case SIZE_nLx2N:
        sub_info->num_sub_part = 2;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = qw * (i == 0 ? 0 : 1) + x;
            sub_info->sub_y[i] = y;
            sub_info->sub_w[i] = qw * (i == 0 ? 1 : 3);
            sub_info->sub_h[i] = h;
        }
        break;
    case SIZE_nRx2N:
        sub_info->num_sub_part = 2;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = qw * (i == 0 ? 0 : 3) + x;
            sub_info->sub_y[i] = y;
            sub_info->sub_w[i] = qw * (i == 0 ? 3 : 1);
            sub_info->sub_h[i] = h;
        }
        break;
    case SIZE_NxN:
        sub_info->num_sub_part = 4;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = qw * (i == 0 || i == 2 ? 0 : 2) + x;
            sub_info->sub_y[i] = qh * (i == 0 || i == 1 ? 0 : 2) + y;
            sub_info->sub_w[i] = qw * 2;
            sub_info->sub_h[i] = qh * 2;
        }
        break;
    default:
        uavs3d_assert(0);
    }
}